

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::load_param(Pooling *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->pooling_type = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar1;
  iVar1 = ParamDict::get(pd,0xb,iVar1);
  this->kernel_h = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->stride_w = iVar1;
  iVar1 = ParamDict::get(pd,0xc,iVar1);
  this->stride_h = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->pad_left = iVar1;
  iVar1 = ParamDict::get(pd,0xe,iVar1);
  this->pad_right = iVar1;
  iVar1 = ParamDict::get(pd,0xd,this->pad_left);
  this->pad_top = iVar1;
  iVar1 = ParamDict::get(pd,0xf,iVar1);
  this->pad_bottom = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->global_pooling = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->pad_mode = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->avgpool_count_include_pad = iVar1;
  return 0;
}

Assistant:

int Pooling::load_param(const ParamDict& pd)
{
    pooling_type = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    stride_w = pd.get(2, 1);
    stride_h = pd.get(12, stride_w);
    pad_left = pd.get(3, 0);
    pad_right = pd.get(14, pad_left);
    pad_top = pd.get(13, pad_left);
    pad_bottom = pd.get(15, pad_top);
    global_pooling = pd.get(4, 0);
    pad_mode = pd.get(5, 0);
    avgpool_count_include_pad = pd.get(6, 0);

    return 0;
}